

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple8b.h
# Opt level: O0

void __thiscall
FastPForLib::Simple8b<true>::encodeArray
          (Simple8b<true> *this,uint32_t *in,size_t length,uint32_t *out,size_t *nvalue)

{
  bool bVar1;
  logic_error *plVar2;
  undefined4 *in_RCX;
  ulong in_RDX;
  uint32_t *in_RSI;
  long *in_R8;
  uint32_t i_27;
  uint32_t i_26;
  uint32_t i_25;
  uint32_t i_24;
  uint32_t i_23;
  uint32_t i_22;
  uint32_t i_21;
  uint32_t i_20;
  uint32_t i_19;
  uint32_t i_18;
  uint32_t i_17;
  uint32_t i_16;
  uint32_t i_15;
  uint32_t i_14;
  uint32_t i_13;
  uint32_t i_12;
  uint32_t i_11;
  uint32_t i_10;
  uint32_t i_9;
  uint32_t i_8;
  uint32_t i_7;
  uint32_t i_6;
  uint32_t i_5;
  uint32_t i_4;
  uint32_t i_3;
  uint32_t i_2;
  uint32_t i_1;
  uint32_t i;
  bool becareful;
  size_t ValuesRemaining;
  uint64_t *out64;
  uint32_t *initout;
  uint32_t NumberOfValuesCoded;
  uint local_118;
  uint local_114;
  uint local_110;
  uint local_10c;
  uint local_108;
  uint local_104;
  uint local_100;
  uint local_fc;
  uint local_f8;
  uint local_f4;
  uint local_f0;
  uint local_ec;
  uint local_e8;
  uint local_e4;
  uint local_e0;
  uint local_dc;
  uint local_d0;
  uint local_cc;
  uint local_c8;
  uint local_c4;
  uint local_c0;
  uint local_bc;
  uint local_b8;
  uint local_b4;
  uint local_b0;
  uint local_ac;
  uint local_a8;
  uint local_a4;
  uint local_a0;
  uint local_9c;
  uint local_98;
  uint local_80;
  uint local_7c;
  uint local_78;
  uint local_74;
  uint local_70;
  uint local_6c;
  uint local_68;
  uint local_64;
  uint local_60;
  uint local_5c;
  uint local_58;
  uint local_54;
  uint local_50;
  ulong local_48;
  uint64_t *local_40;
  uint local_2c;
  uint32_t *local_10;
  
  *in_RCX = (int)in_RDX;
  local_40 = (uint64_t *)(in_RCX + 1);
  local_48 = in_RDX;
  local_10 = in_RSI;
  do {
    if (local_48 < 0xf0) {
      do {
        if (local_48 == 0) {
          *in_R8 = (long)local_40 - (long)in_RCX >> 2;
          return;
        }
        bVar1 = tryme<240u,0u>(local_10,local_48);
        local_118 = (uint)local_48;
        if (bVar1) {
          local_dc = local_118;
          if (0xef < local_48) {
            local_dc = 0xf0;
          }
          local_2c = local_dc;
          *local_40 = 0;
          local_10 = local_10 + local_dc;
        }
        else {
          bVar1 = tryme<120u,0u>(local_10,local_48);
          if (bVar1) {
            local_e0 = local_118;
            if (0x77 < local_48) {
              local_e0 = 0x78;
            }
            local_2c = local_e0;
            *local_40 = 0x1000000000000000;
            local_10 = local_10 + local_e0;
          }
          else {
            bVar1 = tryme<60u,1u>(local_10,local_48);
            if (bVar1) {
              *local_40 = 2;
              local_e4 = local_118;
              if (0x3b < local_48) {
                local_e4 = 0x3c;
              }
              local_2c = local_e4;
              for (local_98 = 0; local_98 < local_e4; local_98 = local_98 + 1) {
                bit_writer(local_40,*local_10,1);
                local_10 = local_10 + 1;
              }
              *local_40 = *local_40 << (0x3cU - (char)local_e4 & 0x3f);
            }
            else {
              bVar1 = tryme<30u,2u>(local_10,local_48);
              if (bVar1) {
                *local_40 = 3;
                local_e8 = local_118;
                if (0x1d < local_48) {
                  local_e8 = 0x1e;
                }
                local_2c = local_e8;
                for (local_9c = 0; local_9c < local_e8; local_9c = local_9c + 1) {
                  bit_writer(local_40,*local_10,2);
                  local_10 = local_10 + 1;
                }
                *local_40 = *local_40 << ((char)local_e8 * -2 + 0x3cU & 0x3f);
              }
              else {
                bVar1 = tryme<20u,3u>(local_10,local_48);
                if (bVar1) {
                  *local_40 = 4;
                  local_ec = local_118;
                  if (0x13 < local_48) {
                    local_ec = 0x14;
                  }
                  local_2c = local_ec;
                  for (local_a0 = 0; local_a0 < local_ec; local_a0 = local_a0 + 1) {
                    bit_writer(local_40,*local_10,3);
                    local_10 = local_10 + 1;
                  }
                  *local_40 = *local_40 << ((char)local_ec * -3 + 0x3cU & 0x3f);
                }
                else {
                  bVar1 = tryme<15u,4u>(local_10,local_48);
                  if (bVar1) {
                    *local_40 = 5;
                    local_f0 = local_118;
                    if (0xe < local_48) {
                      local_f0 = 0xf;
                    }
                    local_2c = local_f0;
                    for (local_a4 = 0; local_a4 < local_f0; local_a4 = local_a4 + 1) {
                      bit_writer(local_40,*local_10,4);
                      local_10 = local_10 + 1;
                    }
                    *local_40 = *local_40 << (0x3cU - (char)(local_f0 << 2) & 0x3f);
                  }
                  else {
                    bVar1 = tryme<12u,5u>(local_10,local_48);
                    if (bVar1) {
                      *local_40 = 6;
                      local_f4 = local_118;
                      if (0xb < local_48) {
                        local_f4 = 0xc;
                      }
                      local_2c = local_f4;
                      for (local_a8 = 0; local_a8 < local_f4; local_a8 = local_a8 + 1) {
                        bit_writer(local_40,*local_10,5);
                        local_10 = local_10 + 1;
                      }
                      *local_40 = *local_40 << ((char)local_f4 * -5 + 0x3cU & 0x3f);
                    }
                    else {
                      bVar1 = tryme<10u,6u>(local_10,local_48);
                      if (bVar1) {
                        *local_40 = 7;
                        local_f8 = local_118;
                        if (9 < local_48) {
                          local_f8 = 10;
                        }
                        local_2c = local_f8;
                        for (local_ac = 0; local_ac < local_f8; local_ac = local_ac + 1) {
                          bit_writer(local_40,*local_10,6);
                          local_10 = local_10 + 1;
                        }
                        *local_40 = *local_40 << ((char)local_f8 * -6 + 0x3cU & 0x3f);
                      }
                      else {
                        bVar1 = tryme<8u,7u>(local_10,local_48);
                        if (bVar1) {
                          *local_40 = 8;
                          local_fc = local_118;
                          if (7 < local_48) {
                            local_fc = 8;
                          }
                          local_2c = local_fc;
                          for (local_b0 = 0; local_b0 < local_fc; local_b0 = local_b0 + 1) {
                            bit_writer(local_40,*local_10,7);
                            local_10 = local_10 + 1;
                          }
                          *local_40 = *local_40 << ((char)local_fc * -7 + 0x3cU & 0x3f);
                        }
                        else {
                          bVar1 = tryme<7u,8u>(local_10,local_48);
                          if (bVar1) {
                            *local_40 = 9;
                            local_100 = local_118;
                            if (6 < local_48) {
                              local_100 = 7;
                            }
                            local_2c = local_100;
                            for (local_b4 = 0; local_b4 < local_100; local_b4 = local_b4 + 1) {
                              bit_writer(local_40,*local_10,8);
                              local_10 = local_10 + 1;
                            }
                            *local_40 = *local_40 << (0x3cU - (char)(local_100 << 3) & 0x3f);
                          }
                          else {
                            bVar1 = tryme<6u,10u>(local_10,local_48);
                            if (bVar1) {
                              *local_40 = 10;
                              local_104 = local_118;
                              if (5 < local_48) {
                                local_104 = 6;
                              }
                              local_2c = local_104;
                              for (local_b8 = 0; local_b8 < local_104; local_b8 = local_b8 + 1) {
                                bit_writer(local_40,*local_10,10);
                                local_10 = local_10 + 1;
                              }
                              *local_40 = *local_40 << ((char)local_104 * -10 + 0x3cU & 0x3f);
                            }
                            else {
                              bVar1 = tryme<5u,12u>(local_10,local_48);
                              if (bVar1) {
                                *local_40 = 0xb;
                                local_108 = local_118;
                                if (4 < local_48) {
                                  local_108 = 5;
                                }
                                local_2c = local_108;
                                for (local_bc = 0; local_bc < local_108; local_bc = local_bc + 1) {
                                  bit_writer(local_40,*local_10,0xc);
                                  local_10 = local_10 + 1;
                                }
                                *local_40 = *local_40 << ((char)local_108 * -0xc + 0x3cU & 0x3f);
                              }
                              else {
                                bVar1 = tryme<4u,15u>(local_10,local_48);
                                if (bVar1) {
                                  *local_40 = 0xc;
                                  local_10c = local_118;
                                  if (3 < local_48) {
                                    local_10c = 4;
                                  }
                                  local_2c = local_10c;
                                  for (local_c0 = 0; local_c0 < local_10c; local_c0 = local_c0 + 1)
                                  {
                                    bit_writer(local_40,*local_10,0xf);
                                    local_10 = local_10 + 1;
                                  }
                                  *local_40 = *local_40 << ((char)local_10c * -0xf + 0x3cU & 0x3f);
                                }
                                else {
                                  bVar1 = tryme<3u,20u>(local_10,local_48);
                                  if (bVar1) {
                                    *local_40 = 0xd;
                                    local_110 = local_118;
                                    if (2 < local_48) {
                                      local_110 = 3;
                                    }
                                    local_2c = local_110;
                                    for (local_c4 = 0; local_c4 < local_110; local_c4 = local_c4 + 1
                                        ) {
                                      bit_writer(local_40,*local_10,0x14);
                                      local_10 = local_10 + 1;
                                    }
                                    *local_40 = *local_40 <<
                                                ((char)local_110 * -0x14 + 0x3cU & 0x3f);
                                  }
                                  else {
                                    bVar1 = tryme<2u,30u>(local_10,local_48);
                                    if (bVar1) {
                                      *local_40 = 0xe;
                                      local_114 = local_118;
                                      if (1 < local_48) {
                                        local_114 = 2;
                                      }
                                      local_2c = local_114;
                                      for (local_c8 = 0; local_c8 < local_114;
                                          local_c8 = local_c8 + 1) {
                                        bit_writer(local_40,*local_10,0x1e);
                                        local_10 = local_10 + 1;
                                      }
                                      *local_40 = *local_40 <<
                                                  ((char)local_114 * -0x1e + 0x3cU & 0x3f);
                                    }
                                    else {
                                      bVar1 = tryme<1u,60u>(local_10,local_48);
                                      if (!bVar1) {
                                        plVar2 = (logic_error *)__cxa_allocate_exception(0x10);
                                        std::logic_error::logic_error(plVar2,"shouldn\'t happen");
                                        __cxa_throw(plVar2,&std::logic_error::typeinfo,
                                                    std::logic_error::~logic_error);
                                      }
                                      *local_40 = 0xf;
                                      if (local_48 != 0) {
                                        local_118 = 1;
                                      }
                                      local_2c = local_118;
                                      for (local_cc = 0; local_cc < local_118;
                                          local_cc = local_cc + 1) {
                                        bit_writer(local_40,*local_10,0x3c);
                                        local_10 = local_10 + 1;
                                      }
                                      *local_40 = *local_40 <<
                                                  ((char)local_118 * -0x3c + 0x3cU & 0x3f);
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        local_40 = local_40 + 1;
        local_48 = local_48 - local_2c;
      } while( true );
    }
    bVar1 = trymefull<120u,0u>(local_10);
    if (bVar1) {
      bVar1 = trymefull<120u,0u>(local_10 + 0x78);
      if (bVar1) {
        local_2c = 0xf0;
        *local_40 = 0;
        local_10 = local_10 + 0xf0;
      }
      else {
        local_2c = 0x78;
        *local_40 = 0x1000000000000000;
        local_10 = local_10 + 0x78;
      }
    }
    else {
      bVar1 = trymefull<60u,1u>(local_10);
      if (bVar1) {
        *local_40 = 2;
        local_2c = 0x3c;
        for (local_50 = 0; local_50 < 0x3c; local_50 = local_50 + 1) {
          bit_writer(local_40,*local_10,1);
          local_10 = local_10 + 1;
        }
        *local_40 = *local_40;
      }
      else {
        bVar1 = trymefull<30u,2u>(local_10);
        if (bVar1) {
          *local_40 = 3;
          local_2c = 0x1e;
          for (local_54 = 0; local_54 < 0x1e; local_54 = local_54 + 1) {
            bit_writer(local_40,*local_10,2);
            local_10 = local_10 + 1;
          }
          *local_40 = *local_40;
        }
        else {
          bVar1 = trymefull<20u,3u>(local_10);
          if (bVar1) {
            *local_40 = 4;
            local_2c = 0x14;
            for (local_58 = 0; local_58 < 0x14; local_58 = local_58 + 1) {
              bit_writer(local_40,*local_10,3);
              local_10 = local_10 + 1;
            }
            *local_40 = *local_40;
          }
          else {
            bVar1 = trymefull<15u,4u>(local_10);
            if (bVar1) {
              *local_40 = 5;
              local_2c = 0xf;
              for (local_5c = 0; local_5c < 0xf; local_5c = local_5c + 1) {
                bit_writer(local_40,*local_10,4);
                local_10 = local_10 + 1;
              }
              *local_40 = *local_40;
            }
            else {
              bVar1 = trymefull<12u,5u>(local_10);
              if (bVar1) {
                *local_40 = 6;
                local_2c = 0xc;
                for (local_60 = 0; local_60 < 0xc; local_60 = local_60 + 1) {
                  bit_writer(local_40,*local_10,5);
                  local_10 = local_10 + 1;
                }
                *local_40 = *local_40;
              }
              else {
                bVar1 = trymefull<10u,6u>(local_10);
                if (bVar1) {
                  *local_40 = 7;
                  local_2c = 10;
                  for (local_64 = 0; local_64 < 10; local_64 = local_64 + 1) {
                    bit_writer(local_40,*local_10,6);
                    local_10 = local_10 + 1;
                  }
                  *local_40 = *local_40;
                }
                else {
                  bVar1 = trymefull<8u,7u>(local_10);
                  if (bVar1) {
                    *local_40 = 8;
                    local_2c = 8;
                    for (local_68 = 0; local_68 < 8; local_68 = local_68 + 1) {
                      bit_writer(local_40,*local_10,7);
                      local_10 = local_10 + 1;
                    }
                    *local_40 = *local_40 << 4;
                  }
                  else {
                    bVar1 = trymefull<7u,8u>(local_10);
                    if (bVar1) {
                      *local_40 = 9;
                      local_2c = 7;
                      for (local_6c = 0; local_6c < 7; local_6c = local_6c + 1) {
                        bit_writer(local_40,*local_10,8);
                        local_10 = local_10 + 1;
                      }
                      *local_40 = *local_40 << 4;
                    }
                    else {
                      bVar1 = trymefull<6u,10u>(local_10);
                      if (bVar1) {
                        *local_40 = 10;
                        local_2c = 6;
                        for (local_70 = 0; local_70 < 6; local_70 = local_70 + 1) {
                          bit_writer(local_40,*local_10,10);
                          local_10 = local_10 + 1;
                        }
                        *local_40 = *local_40;
                      }
                      else {
                        bVar1 = trymefull<5u,12u>(local_10);
                        if (bVar1) {
                          *local_40 = 0xb;
                          if (local_48 < 5) {
                            local_d0 = (uint)local_48;
                          }
                          else {
                            local_d0 = 5;
                          }
                          local_2c = local_d0;
                          for (local_74 = 0; local_74 < local_d0; local_74 = local_74 + 1) {
                            bit_writer(local_40,*local_10,0xc);
                            local_10 = local_10 + 1;
                          }
                          *local_40 = *local_40 << ((char)local_d0 * -0xc + 0x3cU & 0x3f);
                        }
                        else {
                          bVar1 = trymefull<4u,15u>(local_10);
                          if (bVar1) {
                            *local_40 = 0xc;
                            local_2c = 4;
                            for (local_78 = 0; local_78 < 4; local_78 = local_78 + 1) {
                              bit_writer(local_40,*local_10,0xf);
                              local_10 = local_10 + 1;
                            }
                            *local_40 = *local_40;
                          }
                          else {
                            bVar1 = trymefull<3u,20u>(local_10);
                            if (bVar1) {
                              *local_40 = 0xd;
                              local_2c = 3;
                              for (local_7c = 0; local_7c < 3; local_7c = local_7c + 1) {
                                bit_writer(local_40,*local_10,0x14);
                                local_10 = local_10 + 1;
                              }
                              *local_40 = *local_40;
                            }
                            else {
                              bVar1 = trymefull<2u,30u>(local_10);
                              if (bVar1) {
                                *local_40 = 0xe;
                                local_2c = 2;
                                for (local_80 = 0; local_80 < 2; local_80 = local_80 + 1) {
                                  bit_writer(local_40,*local_10,0x1e);
                                  local_10 = local_10 + 1;
                                }
                                *local_40 = *local_40;
                              }
                              else {
                                bVar1 = trymefull<1u,60u>(local_10);
                                if (!bVar1) {
                                  plVar2 = (logic_error *)__cxa_allocate_exception(0x10);
                                  std::logic_error::logic_error(plVar2,"shouldn\'t happen");
                                  __cxa_throw(plVar2,&std::logic_error::typeinfo,
                                              std::logic_error::~logic_error);
                                }
                                *local_40 = 0xf;
                                local_2c = 1;
                                bVar1 = false;
                                while (!bVar1) {
                                  bit_writer(local_40,*local_10,0x3c);
                                  local_10 = local_10 + 1;
                                  bVar1 = true;
                                }
                                *local_40 = *local_40;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    local_40 = local_40 + 1;
    local_48 = local_48 - local_2c;
  } while( true );
}

Assistant:

void Simple8b<MarkLength>::encodeArray(const uint32_t *in, const size_t length,
                                       uint32_t *out, size_t &nvalue) {
#ifndef NDEBUG
  const uint32_t *const initin(in);
#endif
  uint32_t NumberOfValuesCoded = 0;
  const uint32_t *const initout(out);
  if (MarkLength) {
    *out = static_cast<uint32_t>(length);
    ++out;
  }
  // this may lead to unaligned access. Performance may be affected.
  // not much of an effect in practice on recent Intel processors.
  uint64_t *out64 = reinterpret_cast<uint64_t *>(out);
  size_t ValuesRemaining(length);
  // precompute
  const bool becareful(false);
  while (ValuesRemaining >= 240) {
    if (trymefull<120, 0>(in)) {
      if (trymefull<120, 0>(in + 120)) {
        NumberOfValuesCoded = 240;
        out64[0] = 0;
        in += NumberOfValuesCoded;
        if (becareful)
          assert(which(out64) == 0);

      } else {
        NumberOfValuesCoded = 120;
        out64[0] = 1ULL << (64 - SIMPLE8B_LOGDESC);
        in += NumberOfValuesCoded;
        if (becareful)
          assert(which(out64) == 1);
      }
    } else if (trymefull<60, 1>(in)) {
      out64[0] = 2;
      NumberOfValuesCoded = 60;
      for (uint32_t i = 0; i < 60; i++) {
        bit_writer(out64, *in++, 1);
      }
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 1 * 60;
      if (becareful)
        assert(which(out64) == 2);
    } else if (trymefull<30, 2>(in)) {
      out64[0] = 3;
      NumberOfValuesCoded = 30;
      for (uint32_t i = 0; i < 30; i++)
        bit_writer(out64, *in++, 2);
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 2 * 30;
      if (becareful)
        assert(which(out64) == 3);
    } else if (trymefull<20, 3>(in)) {
      out64[0] = 4;
      NumberOfValuesCoded = 20;
      for (uint32_t i = 0; i < 20; i++)
        bit_writer(out64, *in++, 3);
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 3 * 20;
      if (becareful)
        assert(which(out64) == 4);
    } else if (trymefull<15, 4>(in)) {
      out64[0] = 5;
      NumberOfValuesCoded = 15;
      for (uint32_t i = 0; i < 15; i++)
        bit_writer(out64, *in++, 4);
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 4 * 15;
      if (becareful)
        assert(which(out64) == 5);
    } else if (trymefull<12, 5>(in)) {
      out64[0] = 6;
      NumberOfValuesCoded = 12;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out64, *in++, 5);
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 5 * 12;
      if (becareful)
        assert(which(out64) == 6);
    } else if (trymefull<10, 6>(in)) {
      out64[0] = 7;
      NumberOfValuesCoded = 10;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out64, *in++, 6);
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 6 * 10;
      if (becareful)
        assert(which(out64) == 7);
    } else if (trymefull<8, 7>(in)) {
      out64[0] = 8;
      NumberOfValuesCoded = 8;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out64, *in++, 7);
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 7 * 8;
      if (becareful)
        assert(which(out64) == 8);
    } else if (trymefull<7, 8>(in)) {
      out64[0] = 9;
      NumberOfValuesCoded = 7;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out64, *in++, 8);
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 8 * 7;
      if (becareful)
        assert(which(out64) == 9);
    } else if (trymefull<6, 10>(in)) {
      out64[0] = 10;
      NumberOfValuesCoded = 6;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out64, *in++, 10);
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 10 * 6;
      if (becareful)
        assert(which(out64) == 10);
    } else if (trymefull<5, 12>(in)) {
      out64[0] = 11;
      NumberOfValuesCoded =
          (ValuesRemaining < 5) ? static_cast<uint32_t>(ValuesRemaining) : 5;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out64, *in++, 12);
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 12 * NumberOfValuesCoded;
      if (becareful)
        assert(which(out64) == 11);
    } else if (trymefull<4, 15>(in)) {
      out64[0] = 12;
      NumberOfValuesCoded = 4;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out64, *in++, 15);
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 15 * 4;
      if (becareful)
        assert(which(out64) == 12);
    } else if (trymefull<3, 20>(in)) {
      out64[0] = 13;
      NumberOfValuesCoded = 3;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out64, *in++, 20);
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 20 * 3;
      if (becareful)
        assert(which(out64) == 13);
    } else if (trymefull<2, 30>(in)) {
      out64[0] = 14;
      NumberOfValuesCoded = 2;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out64, *in++, 30);
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 30 * 2;
      if (becareful)
        assert(which(out64) == 14);
    } else if (trymefull<1, 60>(in)) {
      out64[0] = 15;
      NumberOfValuesCoded = 1;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out64, *in++, 60);
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 60 * 1;
      if (becareful)
        assert(which(out64) == 15);
    } else {
      throw std::logic_error("shouldn't happen");
    }
    ++out64;

    ValuesRemaining -= NumberOfValuesCoded;
  }

  while (ValuesRemaining > 0) {
    if (tryme<240, 0>(in, ValuesRemaining)) {
      NumberOfValuesCoded = (ValuesRemaining < 240)
                                ? static_cast<uint32_t>(ValuesRemaining)
                                : 240;
      out64[0] = 0;
      in += NumberOfValuesCoded;
      if (becareful)
        assert(which(out64) == 0);
    } else if (tryme<120, 0>(in, ValuesRemaining)) {
      NumberOfValuesCoded = (ValuesRemaining < 120)
                                ? static_cast<uint32_t>(ValuesRemaining)
                                : 120;
      out64[0] = 1ULL << (64 - SIMPLE8B_LOGDESC);
      in += NumberOfValuesCoded;
      if (becareful)
        assert(which(out64) == 1);
    } else if (tryme<60, 1>(in, ValuesRemaining)) {
      out64[0] = 2;
      NumberOfValuesCoded =
          (ValuesRemaining < 60) ? static_cast<uint32_t>(ValuesRemaining) : 60;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++) {
        bit_writer(out64, *in++, 1);
      }
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 1 * NumberOfValuesCoded;
      if (becareful)
        assert(which(out64) == 2);
    } else if (tryme<30, 2>(in, ValuesRemaining)) {
      out64[0] = 3;
      NumberOfValuesCoded =
          (ValuesRemaining < 30) ? static_cast<uint32_t>(ValuesRemaining) : 30;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out64, *in++, 2);
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 2 * NumberOfValuesCoded;
      if (becareful)
        assert(which(out64) == 3);
    } else if (tryme<20, 3>(in, ValuesRemaining)) {
      out64[0] = 4;
      NumberOfValuesCoded =
          (ValuesRemaining < 20) ? static_cast<uint32_t>(ValuesRemaining) : 20;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out64, *in++, 3);
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 3 * NumberOfValuesCoded;
      if (becareful)
        assert(which(out64) == 4);
    } else if (tryme<15, 4>(in, ValuesRemaining)) {
      out64[0] = 5;
      NumberOfValuesCoded =
          (ValuesRemaining < 15) ? static_cast<uint32_t>(ValuesRemaining) : 15;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out64, *in++, 4);
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 4 * NumberOfValuesCoded;
      if (becareful)
        assert(which(out64) == 5);
    } else if (tryme<12, 5>(in, ValuesRemaining)) {
      out64[0] = 6;
      NumberOfValuesCoded =
          (ValuesRemaining < 12) ? static_cast<uint32_t>(ValuesRemaining) : 12;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out64, *in++, 5);
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 5 * NumberOfValuesCoded;
      if (becareful)
        assert(which(out64) == 6);
    } else if (tryme<10, 6>(in, ValuesRemaining)) {
      out64[0] = 7;
      NumberOfValuesCoded =
          (ValuesRemaining < 10) ? static_cast<uint32_t>(ValuesRemaining) : 10;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out64, *in++, 6);
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 6 * NumberOfValuesCoded;
      if (becareful)
        assert(which(out64) == 7);
    } else if (tryme<8, 7>(in, ValuesRemaining)) {
      out64[0] = 8;
      NumberOfValuesCoded =
          (ValuesRemaining < 8) ? static_cast<uint32_t>(ValuesRemaining) : 8;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out64, *in++, 7);
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 7 * NumberOfValuesCoded;
      if (becareful)
        assert(which(out64) == 8);
    } else if (tryme<7, 8>(in, ValuesRemaining)) {
      out64[0] = 9;
      NumberOfValuesCoded =
          (ValuesRemaining < 7) ? static_cast<uint32_t>(ValuesRemaining) : 7;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out64, *in++, 8);
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 8 * NumberOfValuesCoded;
      if (becareful)
        assert(which(out64) == 9);
    } else if (tryme<6, 10>(in, ValuesRemaining)) {
      out64[0] = 10;
      NumberOfValuesCoded =
          (ValuesRemaining < 6) ? static_cast<uint32_t>(ValuesRemaining) : 6;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out64, *in++, 10);
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 10 * NumberOfValuesCoded;
      if (becareful)
        assert(which(out64) == 10);
    } else if (tryme<5, 12>(in, ValuesRemaining)) {
      out64[0] = 11;
      NumberOfValuesCoded =
          (ValuesRemaining < 5) ? static_cast<uint32_t>(ValuesRemaining) : 5;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out64, *in++, 12);
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 12 * NumberOfValuesCoded;
      if (becareful)
        assert(which(out64) == 11);
    } else if (tryme<4, 15>(in, ValuesRemaining)) {
      out64[0] = 12;
      NumberOfValuesCoded =
          (ValuesRemaining < 4) ? static_cast<uint32_t>(ValuesRemaining) : 4;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out64, *in++, 15);
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 15 * NumberOfValuesCoded;
      if (becareful)
        assert(which(out64) == 12);
    } else if (tryme<3, 20>(in, ValuesRemaining)) {
      out64[0] = 13;
      NumberOfValuesCoded =
          (ValuesRemaining < 3) ? static_cast<uint32_t>(ValuesRemaining) : 3;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out64, *in++, 20);
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 20 * NumberOfValuesCoded;
      if (becareful)
        assert(which(out64) == 13);
    } else if (tryme<2, 30>(in, ValuesRemaining)) {
      out64[0] = 14;
      NumberOfValuesCoded =
          (ValuesRemaining < 2) ? static_cast<uint32_t>(ValuesRemaining) : 2;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out64, *in++, 30);
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 30 * NumberOfValuesCoded;
      if (becareful)
        assert(which(out64) == 14);
    } else if (tryme<1, 60>(in, ValuesRemaining)) {
      out64[0] = 15;
      NumberOfValuesCoded = (ValuesRemaining < 1) ? uint32_t(ValuesRemaining) : 1;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out64, *in++, 60);
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 60 * NumberOfValuesCoded;
      if (becareful)
        assert(which(out64) == 15);
    } else {
      throw std::logic_error("shouldn't happen");
    }
    if (becareful)
      ASSERT(initin + length - ValuesRemaining + NumberOfValuesCoded == in,
          std::to_string(which(out64)));
    ++out64;

    ValuesRemaining -= NumberOfValuesCoded;
  }
  assert(initin + length == in);
  nvalue = reinterpret_cast<uint32_t *>(out64) - initout;
}